

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  thread local_20;
  thread count_thread2;
  thread count_thread1;
  
  std::thread::thread<void(&)(),,void>(&count_thread2,count);
  std::thread::thread<void(&)(),,void>(&local_20,count);
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&local_20);
  std::thread::~thread(&count_thread2);
  return 0;
}

Assistant:

int main() {
//  std::thread test_thread(test);
//  test_thread.join();

  std::thread count_thread1(count), count_thread2(count);
  count_thread1.join();
  count_thread2.join();
//  test();
//  ins::LLogMessage("a.txt", "aaa", 1, 1) << "Aaa";
  return 0;
}